

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vehicle.cpp
# Opt level: O0

bool __thiscall Vehicle::collides_with(Vehicle *this,Vehicle *other,double time_t)

{
  int iVar1;
  Position PVar2;
  Position PVar3;
  bool local_61;
  Position vehicle_2;
  Position vehicle_1;
  double time_t_local;
  Vehicle *other_local;
  Vehicle *this_local;
  
  PVar2 = position_at(this,time_t);
  PVar3 = position_at(other,time_t);
  local_61 = false;
  if ((PVar2.first == PVar3.first) && (!NAN(PVar2.first) && !NAN(PVar3.first))) {
    iVar1 = PVar2.second - PVar3.second;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    local_61 = iVar1 <= this->m_L;
  }
  return local_61;
}

Assistant:

bool Vehicle::collides_with(Vehicle other, double time_t)
{
	/*
    Simple collision detection.
    */
    Position vehicle_1 = position_at(time_t);
    Position vehicle_2 = other.position_at(time_t);
    return (vehicle_1.first == vehicle_2.first) && (abs(vehicle_1.second-vehicle_2.second) <= m_L);
}